

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmopl.cpp
# Opt level: O0

void advance_noise(FM_OPL *OPL)

{
  uint local_14;
  int i;
  FM_OPL *OPL_local;
  
  OPL->noise_p = OPL->noise_f + OPL->noise_p;
  local_14 = OPL->noise_p;
  OPL->noise_p = OPL->noise_p & 0xffff;
  for (local_14 = local_14 >> 0x10; local_14 != 0; local_14 = local_14 - 1) {
    if ((OPL->noise_rng & 1) != 0) {
      OPL->noise_rng = OPL->noise_rng ^ 0x800302;
    }
    OPL->noise_rng = OPL->noise_rng >> 1;
  }
  return;
}

Assistant:

INLINE void advance_noise(FM_OPL *OPL)
{
	int i;

	/*	The Noise Generator of the YM3812 is 23-bit shift register.
	*	Period is equal to 2^23-2 samples.
	*	Register works at sampling frequency of the chip, so output
	*	can change on every sample.
	*
	*	Output of the register and input to the bit 22 is:
	*	bit0 XOR bit14 XOR bit15 XOR bit22
	*
	*	Simply use bit 22 as the noise output.
	*/

	OPL->noise_p += OPL->noise_f;
	i = OPL->noise_p >> FREQ_SH;		/* number of events (shifts of the shift register) */
	OPL->noise_p &= FREQ_MASK;
	while (i)
	{
		/*
		UINT32 j;
		j = ( (OPL->noise_rng) ^ (OPL->noise_rng>>14) ^ (OPL->noise_rng>>15) ^ (OPL->noise_rng>>22) ) & 1;
		OPL->noise_rng = (j<<22) | (OPL->noise_rng>>1);
		*/

		/*
			Instead of doing all the logic operations above, we
			use a trick here (and use bit 0 as the noise output).
			The difference is only that the noise bit changes one
			step ahead. This doesn't matter since we don't know
			what is real state of the noise_rng after the reset.
		*/

		if (OPL->noise_rng & 1) OPL->noise_rng ^= 0x800302;
		OPL->noise_rng >>= 1;

		i--;
	}
}